

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalReference.cpp
# Opt level: O2

HierarchicalReference *
slang::ast::HierarchicalReference::fromLookup
          (HierarchicalReference *__return_storage_ptr__,Compilation *compilation,
          LookupResult *result)

{
  int iVar1;
  undefined4 extraout_var;
  size_t extraout_RDX;
  
  if (((result->flags).m_bits & 0x22) == 0) {
    (__return_storage_ptr__->path)._M_ptr = (pointer)0x0;
    (__return_storage_ptr__->path)._M_extent._M_extent_value = 0;
    __return_storage_ptr__->target = (Symbol *)0x0;
    __return_storage_ptr__->expr = (Expression *)0x0;
    __return_storage_ptr__->upwardCount = 0;
  }
  else {
    __return_storage_ptr__->expr = (Expression *)0x0;
    __return_storage_ptr__->target = result->found;
    __return_storage_ptr__->upwardCount = (ulong)result->upwardCount;
    iVar1 = SmallVectorBase<slang::ast::HierarchicalReference::Element>::copy
                      (&(result->path).
                        super_SmallVectorBase<slang::ast::HierarchicalReference::Element>,
                       (EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)&result->path);
    (__return_storage_ptr__->path)._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
    (__return_storage_ptr__->path)._M_extent._M_extent_value = extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

HierarchicalReference HierarchicalReference::fromLookup(Compilation& compilation,
                                                        const LookupResult& result) {
    if (!result.flags.has(LookupResultFlags::IsHierarchical | LookupResultFlags::IfacePort))
        return {};

    HierarchicalReference ref;
    ref.target = result.found;
    ref.upwardCount = result.upwardCount;
    ref.path = result.path.copy(compilation);
    return ref;
}